

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkTransferNames(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p)

{
  int *__ptr;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int Entry;
  int in_EDX;
  int i;
  
  if ((0 < (pNew->vCopies).nSize) || ((p->vCopies).nSize < 1)) {
    __assert_fail("!Wlc_NtkHasCopy(pNew) && Wlc_NtkHasCopy(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                  ,0x23f,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  if (((pNew->vNameIds).nSize < 1) && (0 < (p->vNameIds).nSize)) {
    if ((pNew->pManName == (Abc_Nam_t *)0x0) && (p->pManName != (Abc_Nam_t *)0x0)) {
      Vec_IntFill(&pNew->vNameIds,pNew->nObjsAlloc,in_EDX);
      for (i = 0; i < p->nObjsAlloc; i = i + 1) {
        iVar2 = Vec_IntEntry(&p->vCopies,i);
        if ((iVar2 != 0) && (i < (p->vNameIds).nSize)) {
          iVar2 = Vec_IntEntry(&p->vNameIds,i);
          if (iVar2 != 0) {
            iVar2 = Vec_IntEntry(&p->vCopies,i);
            Entry = Vec_IntEntry(&p->vNameIds,i);
            Vec_IntWriteEntry(&pNew->vNameIds,iVar2,Entry);
          }
        }
      }
      pNew->pManName = p->pManName;
      p->pManName = (Abc_Nam_t *)0x0;
      __ptr = (p->vNameIds).pArray;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        (p->vNameIds).pArray = (int *)0x0;
      }
      (p->vNameIds).nCap = 0;
      (p->vNameIds).nSize = 0;
      pVVar1 = p->vTables;
      pNew->pMemTable = p->pMemTable;
      pNew->vTables = pVVar1;
      p->pMemTable = (Mem_Flex_t *)0x0;
      p->vTables = (Vec_Ptr_t *)0x0;
      return;
    }
    __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                  ,0x241,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  __assert_fail("!Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                ,0x240,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
}

Assistant:

void Wlc_NtkTransferNames( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p )
{
    int i;
    assert( !Wlc_NtkHasCopy(pNew)   && Wlc_NtkHasCopy(p)   );
    assert( !Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p) );
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    Wlc_NtkCleanNameId( pNew );
    for ( i = 0; i < p->nObjsAlloc; i++ )
        if ( Wlc_ObjCopy(p, i) && i < Vec_IntSize(&p->vNameIds) && Wlc_ObjNameId(p, i) )
            Wlc_ObjSetNameId( pNew, Wlc_ObjCopy(p, i), Wlc_ObjNameId(p, i) );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    Vec_IntErase( &p->vNameIds );
    // transfer table
    pNew->pMemTable = p->pMemTable;  p->pMemTable = NULL;
    pNew->vTables = p->vTables;      p->vTables = NULL;
}